

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACTable.cpp
# Opt level: O2

bool __thiscall ACTable::UpdateFDIs(ACTable *this,string *_filter)

{
  string *_s;
  vector<FDInfo,_std::allocator<FDInfo>_> *this_00;
  _Base_ptr p_Var1;
  int iVar2;
  pointer pFVar3;
  bool bVar4;
  __type _Var5;
  _Base_ptr p_Var6;
  vector<FDInfo,_std::allocator<FDInfo>_> *this_01;
  FDInfo *fdi_1;
  FDInfo *this_02;
  vector<FDInfo,_std::allocator<FDInfo>_> vecAgain;
  FDInfo fdi;
  vector<FDInfo,_std::allocator<FDInfo>_> local_5f8;
  FDInfo local_5e0;
  
  bVar4 = CheckEverySoOften(&this->lastUpdate,1.0);
  if (((bVar4) || (_Var5 = std::operator==(_filter,&this->filterInUse), !_Var5)) ||
     (this->bFilterAcOnly != this->bAcOnlyInUse)) {
    _s = &this->filterInUse;
    std::__cxx11::string::_M_assign((string *)_s);
    this->bAcOnlyInUse = this->bFilterAcOnly;
    this_00 = &this->vecFDI;
    std::vector<FDInfo,_std::allocator<FDInfo>_>::clear(this_00);
    if ((this->filterInUse)._M_string_length == 0) {
      std::vector<FDInfo,_std::allocator<FDInfo>_>::reserve
                (this_00,mapFd._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    iVar2 = dataRefs.hideStaticTwr;
    local_5f8.super__Vector_base<FDInfo,_std::allocator<FDInfo>_>._M_impl.super__Vector_impl_data.
    _M_start = (FDInfo *)0x0;
    local_5f8.super__Vector_base<FDInfo,_std::allocator<FDInfo>_>._M_impl.super__Vector_impl_data.
    _M_finish = (FDInfo *)0x0;
    local_5f8.super__Vector_base<FDInfo,_std::allocator<FDInfo>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    for (p_Var6 = mapFd._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        pFVar3 = local_5f8.super__Vector_base<FDInfo,_std::allocator<FDInfo>_>._M_impl.
                 super__Vector_impl_data._M_finish,
        this_02 = local_5f8.super__Vector_base<FDInfo,_std::allocator<FDInfo>_>._M_impl.
                  super__Vector_impl_data._M_start,
        (_Rb_tree_header *)p_Var6 != &mapFd._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      if (((this->bFilterAcOnly != true) ||
          (((p_Var1 = p_Var6[0x1d]._M_left, p_Var1 != (_Base_ptr)0x0 &&
            (*(char *)((long)&p_Var1[0xf]._M_left + 1) == '\x01')) &&
           (((ulong)p_Var1[0xf]._M_left & 1) != 0)))) &&
         ((iVar2 == 0 ||
          (bVar4 = LTFlightData::FDStaticData::isStaticObject
                             ((FDStaticData *)&p_Var6[0x10]._M_right), !bVar4)))) {
        FDInfo::FDInfo(&local_5e0,(LTFlightData *)&p_Var6[2]._M_left);
        this_01 = &local_5f8;
        if ((local_5e0.bUpToDate != true) ||
           (bVar4 = FDInfo::matches(&local_5e0,_s), this_01 = this_00, bVar4)) {
          std::vector<FDInfo,_std::allocator<FDInfo>_>::emplace_back<FDInfo>(this_01,&local_5e0);
        }
        FDInfo::~FDInfo(&local_5e0);
      }
    }
    for (; this_02 != pFVar3; this_02 = this_02 + 1) {
      FDInfo::Update(this_02);
      bVar4 = FDInfo::matches(this_02,_s);
      if (bVar4) {
        std::vector<FDInfo,_std::allocator<FDInfo>_>::emplace_back<FDInfo>(this_00,this_02);
      }
    }
    std::vector<FDInfo,_std::allocator<FDInfo>_>::~vector(&local_5f8);
    bVar4 = true;
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool ACTable::UpdateFDIs (const std::string& _filter)
{
    // short-cut in case of no change
    if (!CheckEverySoOften(lastUpdate, ACT_AC_UPDATE_PERIOD) &&
        _filter == filterInUse &&
        bFilterAcOnly == bAcOnlyInUse)
        return false;
    filterInUse = _filter;
    bAcOnlyInUse = bFilterAcOnly;
    
    // Walk all aircraft, test for match, then add
    vecFDI.clear();
    if (filterInUse.empty())        // reserve storage (if no filter defined)
        vecFDI.reserve(mapFd.size());
    
    // First pass: Add all matching and remember those we couldn't get
    const bool bHideStatic = dataRefs.GetHideStaticTwr();
    std::vector<FDInfo> vecAgain;
    for (const mapLTFlightDataTy::value_type& p: mapFd) {
        // First filter: Visible a/c only?
        if (bFilterAcOnly && (!p.second.hasAc() || !p.second.GetAircraft()->IsVisible()))
            continue;
        // 2nd filter: Don't show static objects
        if (bHideStatic && p.second.GetUnsafeStat().isStaticObject())
            continue;
        // others: test if filter matches
        FDInfo fdi(p.second);
        if (fdi.upToDate()) {
            if (fdi.matches(filterInUse))
                vecFDI.emplace_back(std::move(fdi));
        } else {
            vecAgain.emplace_back(std::move(fdi));
        }
    }
    
    // Second pass: Try those again, which couldn't yet fully update
    for (FDInfo& fdi: vecAgain) {
        fdi.Update();
        if (fdi.matches(filterInUse))
            vecFDI.emplace_back(std::move(fdi));
    }
    
    // Did do an update
    return true;
}